

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O0

string * removeIUPAC(string *sequence)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  string *in_RSI;
  string *in_RDI;
  int i;
  int n;
  undefined4 local_18;
  
  iVar1 = std::__cxx11::string::length();
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
    if (*pcVar2 == 'R') {
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
      *puVar3 = 0x47;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
      if (*pcVar2 == 'Y') {
        puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
        *puVar3 = 0x43;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
        if (*pcVar2 == 'S') {
          puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
          *puVar3 = 0x47;
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
          if (*pcVar2 == 'W') {
            puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
            *puVar3 = 0x41;
          }
          else {
            pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
            if (*pcVar2 == 'K') {
              puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
              *puVar3 = 0x54;
            }
            else {
              pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
              if (*pcVar2 == 'M') {
                puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
                *puVar3 = 0x41;
              }
              else {
                pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
                if (*pcVar2 == 'B') {
                  puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
                  *puVar3 = 0x43;
                }
                else {
                  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
                  if (*pcVar2 == 'D') {
                    puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
                    *puVar3 = 0x54;
                  }
                  else {
                    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
                    if (*pcVar2 == 'H') {
                      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
                      *puVar3 = 0x41;
                    }
                    else {
                      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
                      if (*pcVar2 == 'V') {
                        puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
                        *puVar3 = 0x47;
                      }
                      else {
                        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RSI);
                        if (*pcVar2 == 'N') {
                          puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)in_RSI);
                          *puVar3 = 0x41;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string removeIUPAC(std::string sequence){
    int n = sequence.length();
    for(int i = 0; i<n; ++i){
        if(sequence[i] == 'R') sequence[i] = 'G';
        else if(sequence[i] == 'Y') sequence[i] = 'C';
        else if (sequence[i] == 'S') sequence[i] = 'G';
        else if (sequence[i] == 'W') sequence[i] = 'A';
        else if (sequence[i] == 'K') sequence[i] = 'T';
        else if (sequence[i] == 'M') sequence[i] = 'A';
        else if (sequence[i] == 'B') sequence[i] = 'C';
        else if (sequence[i] == 'D') sequence[i] = 'T';
        else if (sequence[i] == 'H') sequence[i] = 'A';
        else if (sequence[i] == 'V') sequence[i] = 'G';
        else if (sequence[i] == 'N') sequence[i] = 'A';

    }
    return sequence;
}